

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O1

void __thiscall
ON_SubDManagedMeshFragment::CopyHelper(ON_SubDManagedMeshFragment *this,ON_SubDMeshFragment *src)

{
  unsigned_short *puVar1;
  anon_union_4_2_6147a14e_for_ON_Color_15 *paVar2;
  undefined2 uVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  uint *puVar10;
  uint *puVar11;
  ON_SubDMeshFragmentGrid *pOVar12;
  ON_SubDMeshFragmentGrid *pOVar13;
  ON_3dVector quad_normal;
  byte bVar14;
  bool bVar15;
  bool bVar16;
  uchar uVar17;
  uchar uVar18;
  uchar uVar19;
  unsigned_short uVar20;
  unsigned_short uVar21;
  unsigned_short uVar22;
  ON__UINT16 OVar23;
  ON__UINT32 OVar24;
  bool bVar25;
  ushort uVar26;
  ushort uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  size_t sVar31;
  ON_SurfaceCurvature *pOVar32;
  ON_Color *pOVar33;
  double *pdVar34;
  double *pdVar35;
  ON_SurfaceCurvature *k;
  double *pdVar36;
  ON_SurfaceCurvature *pOVar37;
  anon_union_4_2_6147a14e_for_ON_Color_15 *paVar38;
  uint uVar39;
  size_t sVar40;
  long lVar41;
  ON_SurfaceCurvature *pOVar42;
  ushort uVar43;
  uint uVar44;
  bool bVar46;
  bool bVar47;
  bool bVar48;
  bool bVar49;
  double nan3 [3];
  ON_3dPoint quad_points [4];
  double local_d8;
  double local_d0;
  double local_c8;
  ulong local_b8;
  ON_3dVector local_b0;
  ON_3dPoint local_98 [4];
  ulong uVar45;
  
  if (this != (ON_SubDManagedMeshFragment *)src) {
    ON_SubDMeshFragment::Clear(&this->super_ON_SubDMeshFragment);
    uVar44 = src->m_vertex_count_etc & 0x1fff;
    uVar45 = (ulong)uVar44;
    if ((src->m_vertex_count_etc & 0x1fff) != 0) {
      bVar48 = src->m_P == (double *)0x0;
      bVar46 = src->m_P_stride < 3;
      bVar49 = src->m_N == (double *)0x0;
      bVar47 = src->m_N_stride < 3;
      uVar28 = ON_SubDMeshFragment::TextureCoordinateCount(src);
      bVar15 = true;
      bVar14 = 1;
      if (uVar28 != 0) {
        if (uVar28 == uVar44) {
          bVar14 = 0;
        }
        else {
          ON_SubDIncrementErrorCount();
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_fragment.cpp"
                     ,0x4af,"","invalid src.TextureCoordinateCount()");
          bVar14 = 1;
        }
      }
      uVar26 = src->m_vertex_count_etc & 0x1fff;
      uVar43 = (ushort)uVar44;
      if ((uVar26 != 0 && src->m_K_stride != 0) &&
          (src->m_K != (ON_SurfaceCurvature *)0x0 && (src->m_vertex_capacity_etc & 0x4000) != 0)) {
        if (uVar26 == uVar43) {
          bVar15 = false;
        }
        else {
          ON_SubDIncrementErrorCount();
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_fragment.cpp"
                     ,0x4b6,"","invalid src.CurvatureCount()");
        }
      }
      uVar26 = src->m_vertex_count_etc & 0x1fff;
      bVar16 = true;
      if ((uVar26 != 0 && src->m_C_stride != 0) &&
          (src->m_C != (ON_Color *)0x0 && (src->m_vertex_capacity_etc & 0x2000) != 0)) {
        if (uVar26 == uVar43) {
          bVar16 = false;
        }
        else {
          ON_SubDIncrementErrorCount();
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_fragment.cpp"
                     ,0x4bd,"","invalid src.ColorCount()");
        }
      }
      uVar26 = (this->super_ON_SubDMeshFragment).m_vertex_capacity_etc;
      uVar27 = uVar26 & 0x1fff;
      if (uVar27 < uVar43) {
        if (((-1 < (short)uVar26) && (uVar27 != 0)) &&
           ((this->super_ON_SubDMeshFragment).m_P != (double *)0x0)) {
          ON_SubDIncrementErrorCount();
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_fragment.cpp"
                     ,0x4c6,"","unmanaged array capacity is too small.");
          return;
        }
        bVar25 = ON_SubDMeshFragment::ManagedArrays(&this->super_ON_SubDMeshFragment);
        if (bVar25) {
          ON_SubDMeshFragment::DeleteManagedArrays(&this->super_ON_SubDMeshFragment);
        }
        (this->super_ON_SubDMeshFragment).m_vertex_count_etc = 0;
        (this->super_ON_SubDMeshFragment).m_vertex_capacity_etc = 0;
        (this->super_ON_SubDMeshFragment).m_P = (double *)0x0;
        ON_SubDMeshFragment::Internal_LayoutArrays
                  (&this->super_ON_SubDMeshFragment,uVar45,(double *)0x0);
      }
      uVar29 = ON_SubDMeshFragment::TextureCoordinateCapacity(&this->super_ON_SubDMeshFragment);
      uVar39 = (this->super_ON_SubDMeshFragment).m_vertex_capacity_etc & 0x1fff;
      uVar30 = 0;
      uVar28 = uVar39;
      if ((this->super_ON_SubDMeshFragment).m_K_stride == 0) {
        uVar28 = uVar30;
      }
      if ((this->super_ON_SubDMeshFragment).m_K == (ON_SurfaceCurvature *)0x0) {
        uVar28 = uVar30;
      }
      if ((this->super_ON_SubDMeshFragment).m_C_stride == 0) {
        uVar39 = uVar30;
      }
      if ((this->super_ON_SubDMeshFragment).m_C == (ON_Color *)0x0) {
        uVar39 = uVar30;
      }
      local_b8 = uVar45;
      ON_SubDMeshFragment::SetVertexCount(&this->super_ON_SubDMeshFragment,uVar45);
      uVar45 = local_b8;
      uVar3 = src->m_vertex_count_etc;
      (this->super_ON_SubDMeshFragment).m_vertex_count_etc =
           uVar3 & 0x8000 | (this->super_ON_SubDMeshFragment).m_vertex_count_etc & 0x7fff;
      bVar25 = (bool)(bVar14 | uVar29 < uVar44);
      if (!bVar25) {
        (this->super_ON_SubDMeshFragment).m_ctrlnetT[0][0] = src->m_ctrlnetT[0][0];
        (this->super_ON_SubDMeshFragment).m_ctrlnetT[0][1] = src->m_ctrlnetT[0][1];
        (this->super_ON_SubDMeshFragment).m_ctrlnetT[0][2] = src->m_ctrlnetT[0][2];
        (this->super_ON_SubDMeshFragment).m_ctrlnetT[1][0] = src->m_ctrlnetT[1][0];
        (this->super_ON_SubDMeshFragment).m_ctrlnetT[1][1] = src->m_ctrlnetT[1][1];
        (this->super_ON_SubDMeshFragment).m_ctrlnetT[1][2] = src->m_ctrlnetT[1][2];
        (this->super_ON_SubDMeshFragment).m_ctrlnetT[2][0] = src->m_ctrlnetT[2][0];
        (this->super_ON_SubDMeshFragment).m_ctrlnetT[2][1] = src->m_ctrlnetT[2][1];
        (this->super_ON_SubDMeshFragment).m_ctrlnetT[2][2] = src->m_ctrlnetT[2][2];
        (this->super_ON_SubDMeshFragment).m_ctrlnetT[3][0] = src->m_ctrlnetT[3][0];
        (this->super_ON_SubDMeshFragment).m_ctrlnetT[3][1] = src->m_ctrlnetT[3][1];
        (this->super_ON_SubDMeshFragment).m_ctrlnetT[3][2] = src->m_ctrlnetT[3][2];
      }
      uVar44 = (uint)local_b8;
      if (!bVar15 && uVar44 <= uVar28) {
        dVar5 = src->m_ctrlnetK[0].k2;
        (this->super_ON_SubDMeshFragment).m_ctrlnetK[0].k1 = src->m_ctrlnetK[0].k1;
        (this->super_ON_SubDMeshFragment).m_ctrlnetK[0].k2 = dVar5;
        dVar5 = src->m_ctrlnetK[1].k2;
        (this->super_ON_SubDMeshFragment).m_ctrlnetK[1].k1 = src->m_ctrlnetK[1].k1;
        (this->super_ON_SubDMeshFragment).m_ctrlnetK[1].k2 = dVar5;
        dVar5 = src->m_ctrlnetK[2].k2;
        (this->super_ON_SubDMeshFragment).m_ctrlnetK[2].k1 = src->m_ctrlnetK[2].k1;
        (this->super_ON_SubDMeshFragment).m_ctrlnetK[2].k2 = dVar5;
        dVar5 = src->m_ctrlnetK[3].k2;
        (this->super_ON_SubDMeshFragment).m_ctrlnetK[3].k1 = src->m_ctrlnetK[3].k1;
        (this->super_ON_SubDMeshFragment).m_ctrlnetK[3].k2 = dVar5;
      }
      if (!bVar16 && uVar44 <= uVar39) {
        (this->super_ON_SubDMeshFragment).m_ctrlnetC[0].field_0 = src->m_ctrlnetC[0].field_0;
        (this->super_ON_SubDMeshFragment).m_ctrlnetC[1].field_0 = src->m_ctrlnetC[1].field_0;
        (this->super_ON_SubDMeshFragment).m_ctrlnetC[2].field_0 = src->m_ctrlnetC[2].field_0;
        (this->super_ON_SubDMeshFragment).m_ctrlnetC[3].field_0 = src->m_ctrlnetC[3].field_0;
      }
      (this->super_ON_SubDMeshFragment).m_pack_rect[0][0] = src->m_pack_rect[0][0];
      (this->super_ON_SubDMeshFragment).m_pack_rect[0][1] = src->m_pack_rect[0][1];
      (this->super_ON_SubDMeshFragment).m_pack_rect[1][0] = src->m_pack_rect[1][0];
      (this->super_ON_SubDMeshFragment).m_pack_rect[1][1] = src->m_pack_rect[1][1];
      (this->super_ON_SubDMeshFragment).m_pack_rect[2][0] = src->m_pack_rect[2][0];
      (this->super_ON_SubDMeshFragment).m_pack_rect[2][1] = src->m_pack_rect[2][1];
      (this->super_ON_SubDMeshFragment).m_pack_rect[3][0] = src->m_pack_rect[3][0];
      (this->super_ON_SubDMeshFragment).m_pack_rect[3][1] = src->m_pack_rect[3][1];
      dVar5 = (src->m_surface_bbox).m_min.y;
      dVar6 = (src->m_surface_bbox).m_min.z;
      dVar7 = (src->m_surface_bbox).m_max.x;
      dVar8 = (src->m_surface_bbox).m_max.y;
      dVar9 = (src->m_surface_bbox).m_max.z;
      (this->super_ON_SubDMeshFragment).m_surface_bbox.m_min.x = (src->m_surface_bbox).m_min.x;
      (this->super_ON_SubDMeshFragment).m_surface_bbox.m_min.y = dVar5;
      (this->super_ON_SubDMeshFragment).m_surface_bbox.m_min.z = dVar6;
      (this->super_ON_SubDMeshFragment).m_surface_bbox.m_max.x = dVar7;
      (this->super_ON_SubDMeshFragment).m_surface_bbox.m_max.y = dVar8;
      (this->super_ON_SubDMeshFragment).m_surface_bbox.m_max.z = dVar9;
      uVar17 = (src->m_grid).m_reserved2;
      uVar18 = (src->m_grid).m_side_segment_count;
      uVar19 = (src->m_grid).m_reserved3;
      uVar20 = (src->m_grid).m_F_count;
      uVar21 = (src->m_grid).m_F_level_of_detail;
      uVar22 = (src->m_grid).m_F_stride;
      OVar23 = (src->m_grid).m_reserved4;
      OVar24 = (src->m_grid).m_reserved5;
      puVar10 = (src->m_grid).m_F;
      puVar11 = (src->m_grid).m_S;
      pOVar12 = (src->m_grid).m_prev_level_of_detail;
      pOVar13 = (src->m_grid).m_next_level_of_detail;
      (this->super_ON_SubDMeshFragment).m_grid.m_reserved1 = (src->m_grid).m_reserved1;
      (this->super_ON_SubDMeshFragment).m_grid.m_reserved2 = uVar17;
      (this->super_ON_SubDMeshFragment).m_grid.m_side_segment_count = uVar18;
      (this->super_ON_SubDMeshFragment).m_grid.m_reserved3 = uVar19;
      (this->super_ON_SubDMeshFragment).m_grid.m_F_count = uVar20;
      (this->super_ON_SubDMeshFragment).m_grid.m_F_level_of_detail = uVar21;
      (this->super_ON_SubDMeshFragment).m_grid.m_F_stride = uVar22;
      (this->super_ON_SubDMeshFragment).m_grid.m_reserved4 = OVar23;
      (this->super_ON_SubDMeshFragment).m_grid.m_reserved5 = OVar24;
      (this->super_ON_SubDMeshFragment).m_grid.m_F = puVar10;
      (this->super_ON_SubDMeshFragment).m_grid.m_S = puVar11;
      (this->super_ON_SubDMeshFragment).m_grid.m_prev_level_of_detail = pOVar12;
      (this->super_ON_SubDMeshFragment).m_grid.m_next_level_of_detail = pOVar13;
      sVar40 = 0;
      ON_SubDMeshFragment::GetControlNetQuad(src,false,local_98,&local_b0);
      quad_normal.y = local_b0.y;
      quad_normal.x = local_b0.x;
      quad_normal.z = local_b0.z;
      ON_SubDMeshFragment::SetControlNetQuad
                (&this->super_ON_SubDMeshFragment,false,local_98,quad_normal);
      local_d8 = ON_DBL_QNAN;
      local_d0 = ON_DBL_QNAN;
      local_c8 = ON_DBL_QNAN;
      sVar31 = (this->super_ON_SubDMeshFragment).m_P_stride;
      lVar41 = sVar31 * uVar45;
      if (!bVar48 && !bVar46) {
        sVar40 = src->m_P_stride;
      }
      if (0 < lVar41) {
        pdVar34 = (this->super_ON_SubDMeshFragment).m_P;
        if (bVar48 || bVar46) {
          pdVar36 = &local_d8;
        }
        else {
          pdVar36 = src->m_P;
        }
        pdVar35 = pdVar34 + lVar41;
        pdVar36 = pdVar36 + 2;
        do {
          *pdVar34 = pdVar36[-2];
          pdVar34[1] = pdVar36[-1];
          pdVar34[2] = *pdVar36;
          pdVar34 = pdVar34 + sVar31;
          pdVar36 = pdVar36 + sVar40;
        } while (pdVar34 < pdVar35);
      }
      if (bVar49 || bVar47) {
        sVar31 = 0;
      }
      else {
        sVar31 = src->m_N_stride;
      }
      pdVar34 = (this->super_ON_SubDMeshFragment).m_N;
      uVar4 = (this->super_ON_SubDMeshFragment).m_N_stride;
      uVar29 = (this->super_ON_SubDMeshFragment).m_vertex_capacity_etc & 0x1fff;
      if (uVar4 < 3) {
        uVar29 = 0;
      }
      if (pdVar34 == (double *)0x0) {
        uVar29 = 0;
      }
      if ((uVar44 <= uVar29) && (0 < (long)(uVar4 * uVar45))) {
        if (bVar49 || bVar47) {
          pdVar36 = &local_d8;
        }
        else {
          pdVar36 = src->m_N;
        }
        pdVar35 = pdVar34 + uVar4 * uVar45;
        pdVar36 = pdVar36 + 2;
        do {
          *pdVar34 = pdVar36[-2];
          pdVar34[1] = pdVar36[-1];
          pdVar34[2] = *pdVar36;
          pdVar34 = pdVar34 + uVar4;
          pdVar36 = pdVar36 + sVar31;
        } while (pdVar34 < pdVar35);
      }
      if (bVar25) {
        pdVar34 = &local_d8;
        sVar31 = 0;
      }
      else {
        pdVar34 = src->m_T;
        sVar31 = src->m_T_stride;
        ON_SubDMeshFragment::SetTextureCoordinatesExistForExperts
                  (&this->super_ON_SubDMeshFragment,true);
      }
      uVar29 = ON_SubDMeshFragment::TextureCoordinateCapacity(&this->super_ON_SubDMeshFragment);
      if (uVar44 <= uVar29) {
        sVar40 = (this->super_ON_SubDMeshFragment).m_T_stride;
        lVar41 = sVar40 * uVar45;
        if (0 < lVar41) {
          pdVar35 = (this->super_ON_SubDMeshFragment).m_T;
          pdVar36 = pdVar35 + lVar41;
          pdVar34 = pdVar34 + 2;
          do {
            *pdVar35 = pdVar34[-2];
            pdVar35[1] = pdVar34[-1];
            pdVar35[2] = *pdVar34;
            pdVar35 = pdVar35 + sVar40;
            pdVar34 = pdVar34 + sVar31;
          } while (pdVar35 < pdVar36);
        }
      }
      if (!bVar15 && uVar44 <= uVar28) {
        pOVar32 = src->m_K;
        sVar31 = src->m_K_stride;
        puVar1 = &(this->super_ON_SubDMeshFragment).m_vertex_capacity_etc;
        *puVar1 = *puVar1 | 0x4000;
      }
      else {
        pOVar32 = &ON_SurfaceCurvature::Nan;
        sVar31 = 0;
      }
      pOVar37 = (this->super_ON_SubDMeshFragment).m_K;
      sVar40 = (this->super_ON_SubDMeshFragment).m_K_stride;
      uVar28 = (this->super_ON_SubDMeshFragment).m_vertex_capacity_etc & 0x1fff;
      if (sVar40 == 0) {
        uVar28 = 0;
      }
      if (pOVar37 == (ON_SurfaceCurvature *)0x0) {
        uVar28 = 0;
      }
      if ((uVar44 <= uVar28) && (lVar41 = sVar40 * uVar45, 0 < lVar41)) {
        pOVar42 = pOVar37 + lVar41;
        do {
          dVar5 = pOVar32->k2;
          pOVar37->k1 = pOVar32->k1;
          pOVar37->k2 = dVar5;
          pOVar37 = pOVar37 + (this->super_ON_SubDMeshFragment).m_K_stride;
          pOVar32 = pOVar32 + sVar31;
        } while (pOVar37 < pOVar42);
      }
      if (!bVar16 && uVar44 <= uVar39) {
        pOVar33 = src->m_C;
        sVar31 = src->m_C_stride;
        puVar1 = &(this->super_ON_SubDMeshFragment).m_vertex_capacity_etc;
        *puVar1 = *puVar1 | 0x2000;
      }
      else {
        pOVar33 = &ON_Color::UnsetColor;
        sVar31 = 0;
      }
      paVar38 = &((this->super_ON_SubDMeshFragment).m_C)->field_0;
      sVar40 = (this->super_ON_SubDMeshFragment).m_C_stride;
      uVar28 = (this->super_ON_SubDMeshFragment).m_vertex_capacity_etc & 0x1fff;
      if (sVar40 == 0) {
        uVar28 = 0;
      }
      if (paVar38 == (anon_union_4_2_6147a14e_for_ON_Color_15 *)0x0) {
        uVar28 = 0;
      }
      if ((uVar44 <= uVar28) && (lVar41 = sVar40 * uVar45, 0 < lVar41)) {
        paVar2 = paVar38 + lVar41;
        do {
          *paVar38 = pOVar33->field_0;
          paVar38 = paVar38 + (this->super_ON_SubDMeshFragment).m_C_stride;
          pOVar33 = (ON_Color *)(&pOVar33->field_0 + sVar31);
        } while (paVar38 < paVar2);
      }
    }
  }
  return;
}

Assistant:

void ON_SubDManagedMeshFragment::CopyHelper(const ON_SubDMeshFragment& src)
{
  // This makes an exact copy. 
  // See ON_SubDMeshFragment::CopyFrom() can copy high density to low density

  if (this == &src)
    return;
  
  ON_SubDMeshFragment::Clear();

  const size_t vertex_capacity = src.VertexCount();
  if (0 == vertex_capacity)
    return;

  const unsigned P_count = src.PointCount();
  if (0 != P_count && vertex_capacity != P_count)
  {
    ON_SUBD_ERROR("invalid counts");
    return;
  }

  unsigned N_count = src.NormalCount();
  if (0 != N_count && vertex_capacity != N_count)
  {
    ON_SUBD_ERROR("invalid src.NormalCount()");
    N_count = 0;
  }

  unsigned T_count = src.TextureCoordinateCount();
  if (0 != T_count && vertex_capacity != T_count)
  {
    ON_SUBD_ERROR("invalid src.TextureCoordinateCount()");
    T_count = 0;
  }

  unsigned K_count = src.CurvatureCount();
  if (0 != K_count && vertex_capacity != K_count)
  {
    ON_SUBD_ERROR("invalid src.CurvatureCount()");
    K_count = 0;
  }

  unsigned C_count = src.ColorCount();
  if (0 != C_count && vertex_capacity != C_count)
  {
    ON_SUBD_ERROR("invalid src.ColorCount()");
    C_count = 0;
  }


  if (vertex_capacity > this->VertexCapacity())
  {
    if (this->UnmanagedArrays() && this->VertexCapacity() > 0)
    {
      ON_SUBD_ERROR("unmanaged array capacity is too small.");
      return;
    }
    
    if (this->ManagedArrays())
      this->DeleteManagedArrays();

    // allocate managed arrays
    m_vertex_count_etc = 0;
    m_vertex_capacity_etc = 0;
    m_P = nullptr;
    this->Internal_LayoutArrays(vertex_capacity, nullptr);
  }

  if (this->TextureCoordinateCapacity() < vertex_capacity)
    T_count = 0;
  if (this->CurvatureCapacity() < vertex_capacity)
    K_count = 0;
  if (this->ColorCapacity() < vertex_capacity)
    C_count = 0;

  SetVertexCount(vertex_capacity);

  if (src.m_vertex_count_etc & ON_SubDMeshFragment::EtcControlNetQuadBit)
  {
    m_vertex_count_etc |= ON_SubDMeshFragment::EtcControlNetQuadBit;
  } 
  else
  {
    m_vertex_count_etc &= ~ON_SubDMeshFragment::EtcControlNetQuadBit;
  }

  if (T_count > 0)
  {
    m_ctrlnetT[0][0] = src.m_ctrlnetT[0][0];
    m_ctrlnetT[0][1] = src.m_ctrlnetT[0][1];
    m_ctrlnetT[0][2] = src.m_ctrlnetT[0][2];
    m_ctrlnetT[1][0] = src.m_ctrlnetT[1][0];
    m_ctrlnetT[1][1] = src.m_ctrlnetT[1][1];
    m_ctrlnetT[1][2] = src.m_ctrlnetT[1][2];
    m_ctrlnetT[2][0] = src.m_ctrlnetT[2][0];
    m_ctrlnetT[2][1] = src.m_ctrlnetT[2][1];
    m_ctrlnetT[2][2] = src.m_ctrlnetT[2][2];
    m_ctrlnetT[3][0] = src.m_ctrlnetT[3][0];
    m_ctrlnetT[3][1] = src.m_ctrlnetT[3][1];
    m_ctrlnetT[3][2] = src.m_ctrlnetT[3][2];
  }

  if (K_count > 0)
  {
    m_ctrlnetK[0] = src.m_ctrlnetK[0];
    m_ctrlnetK[1] = src.m_ctrlnetK[1];
    m_ctrlnetK[2] = src.m_ctrlnetK[2];
    m_ctrlnetK[3] = src.m_ctrlnetK[3];
  }

  if (C_count > 0)
  {
    m_ctrlnetC[0] = src.m_ctrlnetC[0];
    m_ctrlnetC[1] = src.m_ctrlnetC[1];
    m_ctrlnetC[2] = src.m_ctrlnetC[2];
    m_ctrlnetC[3] = src.m_ctrlnetC[3];
  }

  m_pack_rect[0][0] = src.m_pack_rect[0][0];
  m_pack_rect[0][1] = src.m_pack_rect[0][1];
  m_pack_rect[1][0] = src.m_pack_rect[1][0];
  m_pack_rect[1][1] = src.m_pack_rect[1][1];
  m_pack_rect[2][0] = src.m_pack_rect[2][0];
  m_pack_rect[2][1] = src.m_pack_rect[2][1];
  m_pack_rect[3][0] = src.m_pack_rect[3][0];
  m_pack_rect[3][1] = src.m_pack_rect[3][1];

  this->m_surface_bbox = src.m_surface_bbox;
  this->m_grid = src.m_grid;

  ON_3dPoint quad_points[4];
  ON_3dVector quad_normal;
  src.GetControlNetQuad(false, quad_points, quad_normal);
  this->SetControlNetQuad(false, quad_points, quad_normal);


  const double nan3[3] = { ON_DBL_QNAN, ON_DBL_QNAN, ON_DBL_QNAN };
  const double* src_p;
  size_t src_p_stride;
  double* p;
  double* p1;

  // copy src.m_P[] to m_P[]
  p = m_P;
  p1 = p + (m_P_stride * vertex_capacity);
  if ( P_count > 0 )
  {
    src_p = src.m_P;
    src_p_stride = src.m_P_stride;
  }
  else
  {
    src_p = nan3;
    src_p_stride = 0;
  }
  while (p < p1)
  {
    p[0] = src_p[0];
    p[1] = src_p[1];
    p[2] = src_p[2];
    p += m_P_stride;
    src_p += src_p_stride;
  }

  // copy src.m_N[] to m_N[]
  if (N_count > 0)
  {
    src_p = src.m_N;
    src_p_stride = src.m_N_stride;
  }
  else
  {
    // Pierre, 2023-04-13: Set to Nan when empty source, to stay similar to ON_SubDMeshFragment::CopyFrom()
    src_p = nan3;
    src_p_stride = 0;
  }
  if (this->NormalCapacity() >= vertex_capacity)
  {
    p = m_N;
    p1 = p + (m_N_stride * vertex_capacity);
    while (p < p1)
    {
      p[0] = src_p[0];
      p[1] = src_p[1];
      p[2] = src_p[2];
      p += m_N_stride;
      src_p += src_p_stride;
    }
  }

  // copy src.m_T[] to m_T[]
  if (T_count > 0)
  {
    src_p = src.m_T;
    src_p_stride = src.m_T_stride;
    SetTextureCoordinatesExistForExperts(true);
  }
  else
  {
    // set m_T[] to nans
    src_p = nan3;
    src_p_stride = 0;
  }
  if (this->TextureCoordinateCapacity() >= vertex_capacity)
  {
    p = m_T;
    p1 = p + (m_T_stride * vertex_capacity);
    while (p < p1)
    {
      p[0] = src_p[0];
      p[1] = src_p[1];
      p[2] = src_p[2];
      p += m_T_stride;
      src_p += src_p_stride;
    }
  }

  // copy src.m_K[] to m_K[]
  const ON_SurfaceCurvature* src_k;
  size_t src_k_stride;
  if (K_count > 0)
  {
    // copy curvature
    src_k = src.m_K;
    src_k_stride = src.m_K_stride;
    SetCurvaturesExistForExperts(true);
  }
  else
  {
    src_k = &ON_SurfaceCurvature::Nan;
    src_k_stride = 0;
  }
  if (this->CurvatureCapacity() >= vertex_capacity)
  {
    ON_SurfaceCurvature* k = m_K;
    ON_SurfaceCurvature* k1 = k + (m_K_stride * vertex_capacity);
    while (k < k1)
    {
      *k = *src_k;
      k += m_K_stride;
      src_k += src_k_stride;
    }
  }

  // copy src.m_C[] to m_C[]
  const ON_Color* src_c;
  size_t src_c_stride;
  if (C_count > 0)
  {
    src_c = src.m_C;
    src_c_stride = src.m_C_stride;
    SetColorsExistForExperts(true);
  }
  else
  {
    src_c = &ON_Color::UnsetColor;
    src_c_stride = 0;
  }
  if (this->ColorCapacity() >= vertex_capacity)
  {
    ON_Color* c = m_C;
    ON_Color* c1 = c + (m_C_stride * vertex_capacity);
    while (c < c1)
    {
      *c = *src_c;
      c += m_C_stride;
      src_c += src_c_stride;
    }
  }


}